

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode cr_in_resume_from(Curl_easy *data,Curl_creader *reader,curl_off_t offset)

{
  void *pvVar1;
  ulong uVar2;
  ulong local_1060;
  size_t actuallyread;
  size_t readthisamountnow;
  char scratch [4096];
  long local_40;
  curl_off_t passed;
  int seekerr;
  cr_in_ctx *ctx;
  curl_off_t offset_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  passed._4_4_ = 2;
  if (*(long *)((long)pvVar1 + 0x38) == 0) {
    if ((data->set).seek_func != (curl_seek_callback)0x0) {
      Curl_set_in_callback(data,true);
      passed._4_4_ = (*(data->set).seek_func)((data->set).seek_client,offset,0);
      Curl_set_in_callback(data,false);
    }
    if (passed._4_4_ != 0) {
      local_40 = 0;
      if (passed._4_4_ != 2) {
        Curl_failf(data,"Could not seek stream");
        return CURLE_READ_ERROR;
      }
      do {
        if (offset - local_40 < 0x1001) {
          local_1060 = curlx_sotouz(offset - local_40);
        }
        else {
          local_1060 = 0x1000;
        }
        Curl_set_in_callback(data,true);
        uVar2 = (**(code **)((long)pvVar1 + 0x20))
                          (&readthisamountnow,1,local_1060,*(undefined8 *)((long)pvVar1 + 0x28));
        Curl_set_in_callback(data,false);
        local_40 = uVar2 + local_40;
        if ((uVar2 == 0) || (local_1060 < uVar2)) {
          Curl_failf(data,"Could only read %ld bytes from the input",local_40);
          return CURLE_READ_ERROR;
        }
      } while (local_40 < offset);
    }
    if ((*(long *)((long)pvVar1 + 0x30) < 1) ||
       (*(long *)((long)pvVar1 + 0x30) = *(long *)((long)pvVar1 + 0x30) - offset,
       0 < *(long *)((long)pvVar1 + 0x30))) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf(data,"File already completely uploaded");
      data_local._4_4_ = CURLE_PARTIAL_FILE;
    }
  }
  else {
    data_local._4_4_ = CURLE_READ_ERROR;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cr_in_resume_from(struct Curl_easy *data,
                                  struct Curl_creader *reader,
                                  curl_off_t offset)
{
  struct cr_in_ctx *ctx = reader->ctx;
  int seekerr = CURL_SEEKFUNC_CANTSEEK;

  DEBUGASSERT(data->conn);
  /* already started reading? */
  if(ctx->read_len)
    return CURLE_READ_ERROR;

  if(data->set.seek_func) {
    Curl_set_in_callback(data, TRUE);
    seekerr = data->set.seek_func(data->set.seek_client, offset, SEEK_SET);
    Curl_set_in_callback(data, FALSE);
  }

  if(seekerr != CURL_SEEKFUNC_OK) {
    curl_off_t passed = 0;

    if(seekerr != CURL_SEEKFUNC_CANTSEEK) {
      failf(data, "Could not seek stream");
      return CURLE_READ_ERROR;
    }
    /* when seekerr == CURL_SEEKFUNC_CANTSEEK (cannot seek to offset) */
    do {
      char scratch[4*1024];
      size_t readthisamountnow =
        (offset - passed > (curl_off_t)sizeof(scratch)) ?
        sizeof(scratch) :
        curlx_sotouz(offset - passed);
      size_t actuallyread;

      Curl_set_in_callback(data, TRUE);
      actuallyread = ctx->read_cb(scratch, 1, readthisamountnow,
                                  ctx->cb_user_data);
      Curl_set_in_callback(data, FALSE);

      passed += actuallyread;
      if((actuallyread == 0) || (actuallyread > readthisamountnow)) {
        /* this checks for greater-than only to make sure that the
           CURL_READFUNC_ABORT return code still aborts */
        failf(data, "Could only read %" FMT_OFF_T " bytes from the input",
              passed);
        return CURLE_READ_ERROR;
      }
    } while(passed < offset);
  }

  /* now, decrease the size of the read */
  if(ctx->total_len > 0) {
    ctx->total_len -= offset;

    if(ctx->total_len <= 0) {
      failf(data, "File already completely uploaded");
      return CURLE_PARTIAL_FILE;
    }
  }
  /* we have passed, proceed as normal */
  return CURLE_OK;
}